

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::ObjectIntersector1<false>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  Geometry *this;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  bool bVar16;
  bool bVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  size_t i;
  undefined1 (*pauVar23) [16];
  byte bVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar39 [64];
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2520 [8];
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  undefined1 local_2480 [32];
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 == 8) {
    return false;
  }
  uStack_2398 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar37 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar2 = (context->query_radius).field_0;
    auVar26 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar37 = ZEXT1664(auVar26);
  }
  uVar1 = *(undefined4 *)&(query->p).field_0;
  local_23e0._4_4_ = uVar1;
  local_23e0._0_4_ = uVar1;
  local_23e0._8_4_ = uVar1;
  local_23e0._12_4_ = uVar1;
  local_23e0._16_4_ = uVar1;
  local_23e0._20_4_ = uVar1;
  local_23e0._24_4_ = uVar1;
  local_23e0._28_4_ = uVar1;
  auVar35 = ZEXT3264(local_23e0);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_2400._4_4_ = uVar1;
  local_2400._0_4_ = uVar1;
  local_2400._8_4_ = uVar1;
  local_2400._12_4_ = uVar1;
  local_2400._16_4_ = uVar1;
  local_2400._20_4_ = uVar1;
  local_2400._24_4_ = uVar1;
  local_2400._28_4_ = uVar1;
  auVar36 = ZEXT3264(local_2400);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_2420._4_4_ = uVar1;
  local_2420._0_4_ = uVar1;
  local_2420._8_4_ = uVar1;
  local_2420._12_4_ = uVar1;
  local_2420._16_4_ = uVar1;
  local_2420._20_4_ = uVar1;
  local_2420._24_4_ = uVar1;
  local_2420._28_4_ = uVar1;
  auVar38 = ZEXT3264(local_2420);
  uVar1 = *(undefined4 *)&(context->query_radius).field_0;
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  auVar28._16_4_ = uVar1;
  auVar28._20_4_ = uVar1;
  auVar28._24_4_ = uVar1;
  auVar28._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar30._4_4_ = uVar1;
  auVar30._0_4_ = uVar1;
  auVar30._8_4_ = uVar1;
  auVar30._12_4_ = uVar1;
  auVar30._16_4_ = uVar1;
  auVar30._20_4_ = uVar1;
  auVar30._24_4_ = uVar1;
  auVar30._28_4_ = uVar1;
  pauVar23 = (undefined1 (*) [16])local_2390;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar33._4_4_ = uVar1;
  auVar33._0_4_ = uVar1;
  auVar33._8_4_ = uVar1;
  auVar33._12_4_ = uVar1;
  auVar33._16_4_ = uVar1;
  auVar33._20_4_ = uVar1;
  auVar33._24_4_ = uVar1;
  auVar33._28_4_ = uVar1;
  bVar17 = false;
  do {
    local_2440 = vsubps_avx(auVar35._0_32_,auVar28);
    fVar6 = auVar28._0_4_;
    fVar7 = auVar28._4_4_;
    fVar8 = auVar28._8_4_;
    fVar9 = auVar28._12_4_;
    fVar10 = auVar28._16_4_;
    fVar11 = auVar28._20_4_;
    fVar12 = auVar28._24_4_;
    local_2460 = auVar35._0_4_ + fVar6;
    fStack_245c = auVar35._4_4_ + fVar7;
    fStack_2458 = auVar35._8_4_ + fVar8;
    fStack_2454 = auVar35._12_4_ + fVar9;
    fStack_2450 = auVar35._16_4_ + fVar10;
    fStack_244c = auVar35._20_4_ + fVar11;
    fStack_2448 = auVar35._24_4_ + fVar12;
    fStack_2444 = auVar35._28_4_ + auVar28._28_4_;
    local_2480 = vsubps_avx(auVar36._0_32_,auVar30);
    local_24a0 = auVar36._0_4_ + auVar30._0_4_;
    fStack_249c = auVar36._4_4_ + auVar30._4_4_;
    fStack_2498 = auVar36._8_4_ + auVar30._8_4_;
    fStack_2494 = auVar36._12_4_ + auVar30._12_4_;
    fStack_2490 = auVar36._16_4_ + auVar30._16_4_;
    fStack_248c = auVar36._20_4_ + auVar30._20_4_;
    fStack_2488 = auVar36._24_4_ + auVar30._24_4_;
    fStack_2484 = auVar36._28_4_ + auVar30._28_4_;
    local_24c0 = vsubps_avx(auVar38._0_32_,auVar33);
    local_24e0._0_4_ = auVar38._0_4_ + auVar33._0_4_;
    local_24e0._4_4_ = auVar38._4_4_ + auVar33._4_4_;
    local_24e0._8_4_ = auVar38._8_4_ + auVar33._8_4_;
    local_24e0._12_4_ = auVar38._12_4_ + auVar33._12_4_;
    local_24e0._16_4_ = auVar38._16_4_ + auVar33._16_4_;
    local_24e0._20_4_ = auVar38._20_4_ + auVar33._20_4_;
    local_24e0._24_4_ = auVar38._24_4_ + auVar33._24_4_;
    local_24e0._28_4_ = auVar38._28_4_ + auVar33._28_4_;
    auVar39._0_4_ = fVar6 * fVar6;
    auVar39._4_4_ = fVar7 * fVar7;
    auVar39._8_4_ = fVar8 * fVar8;
    auVar39._12_4_ = fVar9 * fVar9;
    auVar39._16_4_ = fVar10 * fVar10;
    auVar39._20_4_ = fVar11 * fVar11;
    auVar39._28_36_ = in_ZMM12._28_36_;
    auVar39._24_4_ = fVar12 * fVar12;
    in_ZMM12 = ZEXT3264(auVar39._0_32_);
    local_24f0 = auVar37._0_16_;
    local_23c0 = auVar39._0_32_;
LAB_00e7999f:
    do {
      do {
        if (pauVar23 == (undefined1 (*) [16])&local_23a0) {
          return bVar17;
        }
        pauVar18 = pauVar23 + -1;
        pauVar23 = pauVar23 + -1;
      } while (auVar37._0_4_ < *(float *)(*pauVar18 + 8));
      uVar19 = *(ulong *)*pauVar23;
LAB_00e799bd:
      auVar28 = auVar35._0_32_;
      auVar30 = auVar36._0_32_;
      auVar33 = auVar38._0_32_;
      if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
        if ((uVar19 & 8) != 0) goto LAB_00e79dfb;
        auVar13 = vmaxps_avx(auVar28,*(undefined1 (*) [32])(uVar19 + 0x40));
        auVar31 = vminps_avx(auVar13,*(undefined1 (*) [32])(uVar19 + 0x60));
        auVar13 = vmaxps_avx(auVar30,*(undefined1 (*) [32])(uVar19 + 0x80));
        auVar31 = vsubps_avx(auVar31,auVar28);
        auVar28 = vminps_avx(auVar13,*(undefined1 (*) [32])(uVar19 + 0xa0));
        auVar30 = vsubps_avx(auVar28,auVar30);
        auVar28 = vmaxps_avx(auVar33,*(undefined1 (*) [32])(uVar19 + 0xc0));
        auVar28 = vminps_avx(auVar28,*(undefined1 (*) [32])(uVar19 + 0xe0));
        auVar28 = vsubps_avx(auVar28,auVar33);
        local_2520._0_4_ =
             auVar31._0_4_ * auVar31._0_4_ + auVar30._0_4_ * auVar30._0_4_ +
             auVar28._0_4_ * auVar28._0_4_;
        local_2520._4_4_ =
             auVar31._4_4_ * auVar31._4_4_ + auVar30._4_4_ * auVar30._4_4_ +
             auVar28._4_4_ * auVar28._4_4_;
        fStack_2518 = auVar31._8_4_ * auVar31._8_4_ + auVar30._8_4_ * auVar30._8_4_ +
                      auVar28._8_4_ * auVar28._8_4_;
        fStack_2514 = auVar31._12_4_ * auVar31._12_4_ + auVar30._12_4_ * auVar30._12_4_ +
                      auVar28._12_4_ * auVar28._12_4_;
        fStack_2510 = auVar31._16_4_ * auVar31._16_4_ + auVar30._16_4_ * auVar30._16_4_ +
                      auVar28._16_4_ * auVar28._16_4_;
        fStack_250c = auVar31._20_4_ * auVar31._20_4_ + auVar30._20_4_ * auVar30._20_4_ +
                      auVar28._20_4_ * auVar28._20_4_;
        fStack_2508 = auVar31._24_4_ * auVar31._24_4_ + auVar30._24_4_ * auVar30._24_4_ +
                      auVar28._24_4_ * auVar28._24_4_;
        fStack_2504 = auVar31._28_4_ + auVar30._28_4_ + auVar30._28_4_;
        auVar28 = vcmpps_avx(_local_2520,in_ZMM12._0_32_,2);
        auVar30 = vcmpps_avx(*(undefined1 (*) [32])(uVar19 + 0x40),
                             *(undefined1 (*) [32])(uVar19 + 0x60),2);
        auVar28 = vandps_avx(auVar28,auVar30);
        auVar26 = vpackssdw_avx(auVar28._0_16_,auVar28._16_16_);
LAB_00e79a4b:
        auVar26 = vpsllw_avx(auVar26,0xf);
        if ((((((((auVar26 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar26 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar26 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar26 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar26[0xf] < '\0') {
          auVar26 = vpacksswb_avx(auVar26,auVar26);
          bVar24 = SUB161(auVar26 >> 7,0) & 1 | (SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar26 >> 0x17,0) & 1) << 2 | (SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar26 >> 0x27,0) & 1) << 4 | (SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar26 >> 0x37,0) & 1) << 6 | SUB161(auVar26 >> 0x3f,0) << 7;
          uVar25 = uVar19 & 0xfffffffffffffff0;
          lVar20 = 0;
          if (bVar24 != 0) {
            for (; (bVar24 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
            }
          }
          uVar19 = *(ulong *)(uVar25 + lVar20 * 8);
          uVar22 = bVar24 - 1 & (uint)bVar24;
          if (uVar22 != 0) {
            uVar3 = *(uint *)(local_2520 + lVar20 * 4);
            lVar20 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
            uVar5 = *(ulong *)(uVar25 + lVar20 * 8);
            uVar4 = *(uint *)(local_2520 + lVar20 * 4);
            uVar22 = uVar22 - 1 & uVar22;
            if (uVar22 == 0) {
              if (uVar3 < uVar4) {
                *(ulong *)*pauVar23 = uVar5;
                *(uint *)(*pauVar23 + 8) = uVar4;
                pauVar23 = pauVar23 + 1;
              }
              else {
                *(ulong *)*pauVar23 = uVar19;
                *(uint *)(*pauVar23 + 8) = uVar3;
                pauVar23 = pauVar23 + 1;
                uVar19 = uVar5;
              }
            }
            else {
              auVar26._8_8_ = 0;
              auVar26._0_8_ = uVar19;
              auVar26 = vpunpcklqdq_avx(auVar26,ZEXT416(uVar3));
              auVar29._8_8_ = 0;
              auVar29._0_8_ = uVar5;
              auVar29 = vpunpcklqdq_avx(auVar29,ZEXT416(uVar4));
              lVar20 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                }
              }
              auVar32._8_8_ = 0;
              auVar32._0_8_ = *(ulong *)(uVar25 + lVar20 * 8);
              auVar27 = vpunpcklqdq_avx(auVar32,ZEXT416(*(uint *)(local_2520 + lVar20 * 4)));
              auVar32 = vpcmpgtd_avx(auVar29,auVar26);
              uVar22 = uVar22 - 1 & uVar22;
              if (uVar22 == 0) {
                auVar34 = vpshufd_avx(auVar32,0xaa);
                auVar32 = vblendvps_avx(auVar29,auVar26,auVar34);
                auVar26 = vblendvps_avx(auVar26,auVar29,auVar34);
                auVar29 = vpcmpgtd_avx(auVar27,auVar32);
                auVar34 = vpshufd_avx(auVar29,0xaa);
                auVar29 = vblendvps_avx(auVar27,auVar32,auVar34);
                auVar32 = vblendvps_avx(auVar32,auVar27,auVar34);
                auVar27 = vpcmpgtd_avx(auVar32,auVar26);
                auVar34 = vpshufd_avx(auVar27,0xaa);
                auVar27 = vblendvps_avx(auVar32,auVar26,auVar34);
                auVar26 = vblendvps_avx(auVar26,auVar32,auVar34);
                *pauVar23 = auVar26;
                pauVar23[1] = auVar27;
                uVar19 = auVar29._0_8_;
                pauVar23 = pauVar23 + 2;
              }
              else {
                lVar20 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                  }
                }
                auVar34._8_8_ = 0;
                auVar34._0_8_ = *(ulong *)(uVar25 + lVar20 * 8);
                auVar34 = vpunpcklqdq_avx(auVar34,ZEXT416(*(uint *)(local_2520 + lVar20 * 4)));
                uVar22 = uVar22 - 1 & uVar22;
                uVar19 = (ulong)uVar22;
                if (uVar22 == 0) {
                  auVar15 = vpshufd_avx(auVar32,0xaa);
                  auVar32 = vblendvps_avx(auVar29,auVar26,auVar15);
                  auVar26 = vblendvps_avx(auVar26,auVar29,auVar15);
                  auVar29 = vpcmpgtd_avx(auVar34,auVar27);
                  auVar15 = vpshufd_avx(auVar29,0xaa);
                  auVar29 = vblendvps_avx(auVar34,auVar27,auVar15);
                  auVar27 = vblendvps_avx(auVar27,auVar34,auVar15);
                  auVar34 = vpcmpgtd_avx(auVar27,auVar26);
                  auVar15 = vpshufd_avx(auVar34,0xaa);
                  auVar34 = vblendvps_avx(auVar27,auVar26,auVar15);
                  auVar26 = vblendvps_avx(auVar26,auVar27,auVar15);
                  auVar27 = vpcmpgtd_avx(auVar29,auVar32);
                  auVar15 = vpshufd_avx(auVar27,0xaa);
                  auVar27 = vblendvps_avx(auVar29,auVar32,auVar15);
                  auVar29 = vblendvps_avx(auVar32,auVar29,auVar15);
                  auVar32 = vpcmpgtd_avx(auVar34,auVar29);
                  auVar15 = vpshufd_avx(auVar32,0xaa);
                  auVar32 = vblendvps_avx(auVar34,auVar29,auVar15);
                  auVar29 = vblendvps_avx(auVar29,auVar34,auVar15);
                  *pauVar23 = auVar26;
                  pauVar23[1] = auVar29;
                  pauVar23[2] = auVar32;
                  uVar19 = auVar27._0_8_;
                  pauVar23 = pauVar23 + 3;
                }
                else {
                  *pauVar23 = auVar26;
                  pauVar23[1] = auVar29;
                  pauVar23[2] = auVar27;
                  pauVar18 = pauVar23 + 3;
                  pauVar23[3] = auVar34;
                  do {
                    lVar20 = 0;
                    if (uVar19 != 0) {
                      for (; (uVar19 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                      }
                    }
                    auVar27._8_8_ = 0;
                    auVar27._0_8_ = *(ulong *)(uVar25 + lVar20 * 8);
                    auVar26 = vpunpcklqdq_avx(auVar27,ZEXT416(*(uint *)(local_2520 + lVar20 * 4)));
                    pauVar18[1] = auVar26;
                    pauVar18 = pauVar18 + 1;
                    uVar19 = uVar19 & uVar19 - 1;
                  } while (uVar19 != 0);
                  lVar20 = 0;
                  while (pauVar18 != pauVar23) {
                    auVar26 = pauVar23[1];
                    uVar22 = vextractps_avx(auVar26,2);
                    for (lVar21 = 0x10;
                        (lVar20 != lVar21 && (*(uint *)(pauVar23[-1] + lVar21 + 8) < uVar22));
                        lVar21 = lVar21 + -0x10) {
                      *(undefined1 (*) [16])(*pauVar23 + lVar21) =
                           *(undefined1 (*) [16])(pauVar23[-1] + lVar21);
                    }
                    *(undefined1 (*) [16])(*pauVar23 + lVar21) = auVar26;
                    lVar20 = lVar20 + -0x10;
                    pauVar23 = pauVar23 + 1;
                  }
                  uVar19 = *(ulong *)*pauVar18;
                  pauVar23 = pauVar18;
                }
              }
            }
          }
          goto LAB_00e799bd;
        }
        goto LAB_00e7999f;
      }
      if ((uVar19 & 8) == 0) {
        auVar13 = *(undefined1 (*) [32])(uVar19 + 0x40);
        auVar31 = *(undefined1 (*) [32])(uVar19 + 0x60);
        auVar14 = vmaxps_avx(auVar28,auVar13);
        auVar14 = vminps_avx(auVar14,auVar31);
        auVar14 = vsubps_avx(auVar14,auVar28);
        auVar28 = vmaxps_avx(auVar30,*(undefined1 (*) [32])(uVar19 + 0x80));
        auVar28 = vminps_avx(auVar28,*(undefined1 (*) [32])(uVar19 + 0xa0));
        auVar30 = vsubps_avx(auVar28,auVar30);
        auVar28 = vmaxps_avx(auVar33,*(undefined1 (*) [32])(uVar19 + 0xc0));
        auVar28 = vminps_avx(auVar28,*(undefined1 (*) [32])(uVar19 + 0xe0));
        auVar28 = vsubps_avx(auVar28,auVar33);
        local_2520._4_4_ =
             auVar14._4_4_ * auVar14._4_4_ + auVar30._4_4_ * auVar30._4_4_ +
             auVar28._4_4_ * auVar28._4_4_;
        local_2520._0_4_ =
             auVar14._0_4_ * auVar14._0_4_ + auVar30._0_4_ * auVar30._0_4_ +
             auVar28._0_4_ * auVar28._0_4_;
        fStack_2518 = auVar14._8_4_ * auVar14._8_4_ + auVar30._8_4_ * auVar30._8_4_ +
                      auVar28._8_4_ * auVar28._8_4_;
        fStack_2514 = auVar14._12_4_ * auVar14._12_4_ + auVar30._12_4_ * auVar30._12_4_ +
                      auVar28._12_4_ * auVar28._12_4_;
        fStack_2510 = auVar14._16_4_ * auVar14._16_4_ + auVar30._16_4_ * auVar30._16_4_ +
                      auVar28._16_4_ * auVar28._16_4_;
        fStack_250c = auVar14._20_4_ * auVar14._20_4_ + auVar30._20_4_ * auVar30._20_4_ +
                      auVar28._20_4_ * auVar28._20_4_;
        fStack_2508 = auVar14._24_4_ * auVar14._24_4_ + auVar30._24_4_ * auVar30._24_4_ +
                      auVar28._24_4_ * auVar28._24_4_;
        fStack_2504 = auVar14._28_4_ + auVar30._28_4_ + auVar28._28_4_;
        auVar28 = vcmpps_avx(auVar13,auVar31,2);
        auVar30 = vcmpps_avx(*(undefined1 (*) [32])(uVar19 + 0xa0),local_2480,5);
        auVar28 = vandps_avx(auVar28,auVar30);
        auVar14._4_4_ = fStack_245c;
        auVar14._0_4_ = local_2460;
        auVar14._8_4_ = fStack_2458;
        auVar14._12_4_ = fStack_2454;
        auVar14._16_4_ = fStack_2450;
        auVar14._20_4_ = fStack_244c;
        auVar14._24_4_ = fStack_2448;
        auVar14._28_4_ = fStack_2444;
        auVar30 = vcmpps_avx(auVar13,auVar14,2);
        auVar13._4_4_ = fStack_249c;
        auVar13._0_4_ = local_24a0;
        auVar13._8_4_ = fStack_2498;
        auVar13._12_4_ = fStack_2494;
        auVar13._16_4_ = fStack_2490;
        auVar13._20_4_ = fStack_248c;
        auVar13._24_4_ = fStack_2488;
        auVar13._28_4_ = fStack_2484;
        auVar33 = vcmpps_avx(*(undefined1 (*) [32])(uVar19 + 0x80),auVar13,2);
        auVar30 = vandps_avx(auVar33,auVar30);
        auVar33 = vcmpps_avx(*(undefined1 (*) [32])(uVar19 + 0xe0),local_24c0,5);
        auVar28 = vandps_avx(auVar28,auVar33);
        auVar33 = vcmpps_avx(auVar31,local_2440,5);
        auVar13 = vcmpps_avx(*(undefined1 (*) [32])(uVar19 + 0xc0),local_24e0,2);
        auVar33 = vandps_avx(auVar13,auVar33);
        auVar30 = vandps_avx(auVar30,auVar33);
        auVar28 = vandps_avx(auVar30,auVar28);
        auVar31._8_4_ = 0xffff;
        auVar31._0_8_ = 0xffff0000ffff;
        auVar31._12_4_ = 0xffff;
        auVar31._16_4_ = 0xffff;
        auVar31._20_4_ = 0xffff;
        auVar31._24_4_ = 0xffff;
        auVar31._28_4_ = 0xffff;
        auVar28 = vandps_avx(auVar28,auVar31);
        auVar26 = vpackusdw_avx(auVar28._0_16_,auVar28._16_16_);
        goto LAB_00e79a4b;
      }
LAB_00e79dfb:
      bVar24 = 0;
      for (lVar20 = 0; (ulong)((uint)uVar19 & 0xf) - 8 != lVar20; lVar20 = lVar20 + 1) {
        uVar22 = *(uint *)((uVar19 & 0xfffffffffffffff0) + lVar20 * 8);
        this = (context->scene->geometries).items[uVar22].ptr;
        context->geomID = uVar22;
        context->primID = *(uint *)((uVar19 & 0xfffffffffffffff0) + 4 + lVar20 * 8);
        bVar16 = Geometry::pointQuery(this,query,context);
        in_ZMM12 = ZEXT3264(local_23c0);
        auVar38 = ZEXT3264(local_2420);
        auVar36 = ZEXT3264(local_2400);
        auVar35 = ZEXT3264(local_23e0);
        bVar24 = bVar24 | bVar16;
      }
      auVar37 = ZEXT1664(local_24f0);
    } while (bVar24 == 0);
    uVar1 = *(undefined4 *)&(context->query_radius).field_0;
    auVar28._4_4_ = uVar1;
    auVar28._0_4_ = uVar1;
    auVar28._8_4_ = uVar1;
    auVar28._12_4_ = uVar1;
    auVar28._16_4_ = uVar1;
    auVar28._20_4_ = uVar1;
    auVar28._24_4_ = uVar1;
    auVar28._28_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar30._4_4_ = uVar1;
    auVar30._0_4_ = uVar1;
    auVar30._8_4_ = uVar1;
    auVar30._12_4_ = uVar1;
    auVar30._16_4_ = uVar1;
    auVar30._20_4_ = uVar1;
    auVar30._24_4_ = uVar1;
    auVar30._28_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar33._4_4_ = uVar1;
    auVar33._0_4_ = uVar1;
    auVar33._8_4_ = uVar1;
    auVar33._12_4_ = uVar1;
    auVar33._16_4_ = uVar1;
    auVar33._20_4_ = uVar1;
    auVar33._24_4_ = uVar1;
    auVar33._28_4_ = uVar1;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar37 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      auVar26 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
      auVar37 = ZEXT1664(auVar26);
    }
    bVar17 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }